

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

Aig_Man_t * Saig_ManTrimPis(Aig_Man_t *p)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p1;
  int iVar8;
  
  bVar1 = true;
  for (iVar8 = 0; iVar8 < p->nTruePis; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar8);
    if ((*(uint *)((long)pvVar3 + 0x18) & 0xffffffc0) != 0) {
      bVar1 = false;
    }
  }
  p_00 = Aig_ManStart(p->vObjs->nSize - p->nDeleted);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  p_00->nConstrs = p->nConstrs;
  pVVar5 = Vec_IntAlloc(p->nObjs[2]);
  p_00->vCiNumsOrig = pVVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  iVar8 = 0;
  do {
    if (p->vCis->nSize <= iVar8) {
      for (iVar8 = 0; iVar8 < p->vObjs->nSize; iVar8 = iVar8 + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar8);
        if ((pAVar6 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7)) {
          pAVar7 = Aig_ObjChild0Copy(pAVar6);
          p1 = Aig_ObjChild1Copy(pAVar6);
          pAVar7 = Aig_And(p_00,pAVar7,p1);
          (pAVar6->field_5).pData = pAVar7;
        }
      }
      for (iVar8 = 0; iVar8 < p->vCos->nSize; iVar8 = iVar8 + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar8);
        pAVar7 = Aig_ObjChild0Copy(pAVar6);
        pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
        (pAVar6->field_5).pData = pAVar7;
      }
      Aig_ManSetRegNum(p_00,p->nRegs);
      return p_00;
    }
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar8);
    if ((bVar1) || ((*(uint *)&pAVar6->field_0x18 & 0xffffffc0) != 0)) {
LAB_0058c673:
      pAVar7 = Aig_ObjCreateCi(p_00);
      (pAVar6->field_5).pData = pAVar7;
      pVVar5 = p_00->vCiNumsOrig;
      iVar2 = Vec_IntEntry(p->vCiNumsOrig,iVar8);
      Vec_IntPush(pVVar5,iVar2);
    }
    else {
      iVar2 = Saig_ObjIsLo(p,pAVar6);
      if (iVar2 != 0) goto LAB_0058c673;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManTrimPis( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i, fAllPisHaveNoRefs;
    // check the refs of PIs    
    fAllPisHaveNoRefs = 1;
    Saig_ManForEachPi( p, pObj, i )
        if ( pObj->nRefs )
            fAllPisHaveNoRefs = 0;
    // start the new manager
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->nConstrs = p->nConstrs;
    // start mapping of the CI numbers
    pNew->vCiNumsOrig = Vec_IntAlloc( Aig_ManCiNum(p) );
    // map const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        if ( fAllPisHaveNoRefs || pObj->nRefs || Saig_ObjIsLo(p, pObj) )
        {
            pObj->pData = Aig_ObjCreateCi( pNew );
            Vec_IntPush( pNew->vCiNumsOrig, Vec_IntEntry(p->vCiNumsOrig, i) );
        }
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}